

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void defaultFree(TidyAllocator *allocator,void *mem)

{
  void *mem_local;
  TidyAllocator *allocator_local;
  
  if (mem != (void *)0x0) {
    if (g_free == (TidyFree)0x0) {
      free(mem);
    }
    else {
      (*g_free)(mem);
    }
  }
  return;
}

Assistant:

static void TIDY_CALL defaultFree( TidyAllocator* ARG_UNUSED(allocator), void* mem )
{
    if ( mem )
    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_MEMORY)
        freecnt++;
        SPRTF("%d: free    MEM %p\n", freecnt, mem );
#endif
        if ( g_free )
            g_free( mem );
        else
            free( mem );
    }
}